

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_sqlite.cpp
# Opt level: O3

sqlite3_value * duckdb::CastToSQLiteValue::Operation<short>(int16_t input)

{
  sqlite3_value *sqlite_int;
  undefined2 in_register_00000032;
  
  (sqlite_int->str)._M_dataplus._M_p = (pointer)&(sqlite_int->str).field_2;
  (sqlite_int->str)._M_string_length = 0;
  (sqlite_int->str).field_2._M_local_buf[0] = '\0';
  sqlite_int->u = (MemValue)(long)CONCAT22(in_register_00000032,input);
  sqlite_int->type = INTEGER;
  return sqlite_int;
}

Assistant:

sqlite3_value CastToSQLiteValue::Operation(int16_t input) {
	return OperationInt<int16_t>(input);
}